

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::InsertSymbolToRegSlotList
          (FunctionBody *this,RegSlot reg,PropertyId propertyId,RegSlot totalRegsCount)

{
  code *pcVar1;
  bool bVar2;
  PropertyIdOnRegSlotsContainer *pPVar3;
  undefined4 *puVar4;
  
  if (totalRegsCount == 0) {
    return;
  }
  pPVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                     ((FunctionProxy *)this);
  if (pPVar3 == (PropertyIdOnRegSlotsContainer *)0x0) {
    pPVar3 = PropertyIdOnRegSlotsContainer::New
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler);
    FunctionProxy::
    SetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
              ((FunctionProxy *)this,pPVar3);
  }
  pPVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                     ((FunctionProxy *)this);
  if ((pPVar3->propertyIdsForRegSlots).ptr == (int *)0x0) {
    pPVar3 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                       ((FunctionProxy *)this);
    PropertyIdOnRegSlotsContainer::CreateRegSlotsArray
              (pPVar3,((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                      recycler,totalRegsCount);
  }
  pPVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                     ((FunctionProxy *)this);
  if (pPVar3 == (PropertyIdOnRegSlotsContainer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x134e,"(this->GetPropertyIdOnRegSlotsContainer() != nullptr)",
                                "this->GetPropertyIdOnRegSlotsContainer() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pPVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                     ((FunctionProxy *)this);
  PropertyIdOnRegSlotsContainer::Insert(pPVar3,reg,propertyId);
  return;
}

Assistant:

void FunctionBody::InsertSymbolToRegSlotList(RegSlot reg, PropertyId propertyId, RegSlot totalRegsCount)
    {
        if (totalRegsCount > 0)
        {
            if (this->GetPropertyIdOnRegSlotsContainer() == nullptr)
            {
                this->SetPropertyIdOnRegSlotsContainer(PropertyIdOnRegSlotsContainer::New(m_scriptContext->GetRecycler()));
            }

            if (this->GetPropertyIdOnRegSlotsContainer()->propertyIdsForRegSlots == nullptr)
            {
                this->GetPropertyIdOnRegSlotsContainer()->CreateRegSlotsArray(m_scriptContext->GetRecycler(), totalRegsCount);
            }

            Assert(this->GetPropertyIdOnRegSlotsContainer() != nullptr);
            this->GetPropertyIdOnRegSlotsContainer()->Insert(reg, propertyId);
        }
    }